

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::BadNameString::BadNameString(BadNameString *this,string *msg)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"BadNameString",&local_51);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  BadNameString(this,&local_30,&local_50,BadNameString);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }